

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

int ndn_data_tlv_decode_hmac_verify
              (ndn_data_t *data,uint8_t *block_value,uint32_t block_size,ndn_hmac_key_t *hmac_key)

{
  int iVar1;
  uint32_t local_38;
  int result;
  uint32_t be_signed_end;
  uint32_t be_signed_start;
  ndn_hmac_key_t *hmac_key_local;
  uint8_t *puStack_20;
  uint32_t block_size_local;
  uint8_t *block_value_local;
  ndn_data_t *data_local;
  
  _be_signed_end = hmac_key;
  hmac_key_local._4_4_ = block_size;
  puStack_20 = block_value;
  block_value_local = (uint8_t *)data;
  m_measure_tp1 = ndn_time_now_us();
  ndn_data_tlv_decode_no_verify
            ((ndn_data_t *)block_value_local,puStack_20,hmac_key_local._4_4_,(uint32_t *)&result,
             &local_38);
  m_measure_tp2 = ndn_time_now_us();
  printf("DEBUG: %s, L%d: ","ndn_data_tlv_decode_hmac_verify",0x1e1);
  printf("DATA-PKT-DECODING: %lu\n",m_measure_tp2 - m_measure_tp1);
  iVar1 = ndn_hmac_verify(puStack_20 + (uint)result,local_38 - result,block_value_local + 0x601,
                          *(uint32_t *)(block_value_local + 0x684),_be_signed_end);
  m_measure_tp1 = ndn_time_now_us();
  printf("DEBUG: %s, L%d: ","ndn_data_tlv_decode_hmac_verify",0x1e9);
  printf("DATA-PKT-HMAC-VERIFY: %lu\n",m_measure_tp1 - m_measure_tp2);
  data_local._4_4_ = iVar1;
  if (iVar1 == 0) {
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

int
ndn_data_tlv_decode_hmac_verify(ndn_data_t* data, const uint8_t* block_value, uint32_t block_size,
                                const ndn_hmac_key_t* hmac_key)
{
#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp1 = ndn_time_now_us();
#endif

  uint32_t be_signed_start, be_signed_end;
  ndn_data_tlv_decode_no_verify(data, block_value, block_size, &be_signed_start, &be_signed_end);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp2 = ndn_time_now_us();
  NDN_LOG_DEBUG("DATA-PKT-DECODING: %" PRI_ndn_time_us_t "\n", m_measure_tp2 - m_measure_tp1);
#endif

  int result = ndn_hmac_verify(block_value + be_signed_start, be_signed_end - be_signed_start,
                               data->signature.sig_value, data->signature.sig_size, hmac_key);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp1 = ndn_time_now_us();
  NDN_LOG_DEBUG("DATA-PKT-HMAC-VERIFY: %" PRI_ndn_time_us_t "\n", m_measure_tp1 - m_measure_tp2);
#endif

  if (result == 0)
    return 0;
  else
    return result;
}